

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableLazyMessageFieldGenerator::GenerateMembers
          (RepeatedImmutableLazyMessageFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &(this->super_RepeatedImmutableMessageFieldGenerator).variables_;
  io::Printer::Print(printer,variables,
                     "private java.util.List<com.google.protobuf.LazyFieldLite> $name$_;\n");
  PrintExtraFieldInfo(variables,printer);
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public java.util.List<$type$>\n    get$capitalized_name$List() {\n  java.util.List<$type$> list =\n      new java.util.ArrayList<$type$>($name$_.size());\n  for (com.google.protobuf.LazyFieldLite lf : $name$_) {\n    list.add(($type$) lf.getValue($type$.getDefaultInstance()));\n  }\n  return list;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public java.util.List<? extends $type$OrBuilder>\n    get$capitalized_name$OrBuilderList() {\n  return get$capitalized_name$List();\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public int get$capitalized_name$Count() {\n  return $name$_.size();\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$ get$capitalized_name$(int index) {\n  return ($type$)\n      $name$_.get(index).getValue($type$.getDefaultInstance());\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$OrBuilder get$capitalized_name$OrBuilder(\n    int index) {\n  return ($type$OrBuilder)\n      $name$_.get(index).getValue($type$.getDefaultInstance());\n}\n"
                    );
  return;
}

Assistant:

void RepeatedImmutableLazyMessageFieldGenerator::
GenerateMembers(io::Printer* printer) const {
  printer->Print(variables_,
    "private java.util.List<com.google.protobuf.LazyFieldLite> $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.util.List<$type$>\n"
    "    get$capitalized_name$List() {\n"
    "  java.util.List<$type$> list =\n"
    "      new java.util.ArrayList<$type$>($name$_.size());\n"
    "  for (com.google.protobuf.LazyFieldLite lf : $name$_) {\n"
    "    list.add(($type$) lf.getValue($type$.getDefaultInstance()));\n"
    "  }\n"
    "  return list;\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.util.List<? extends $type$OrBuilder>\n"
    "    get$capitalized_name$OrBuilderList() {\n"
    "  return get$capitalized_name$List();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public int get$capitalized_name$Count() {\n"
    "  return $name$_.size();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$(int index) {\n"
    "  return ($type$)\n"
    "      $name$_.get(index).getValue($type$.getDefaultInstance());\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$OrBuilder get$capitalized_name$OrBuilder(\n"
    "    int index) {\n"
    "  return ($type$OrBuilder)\n"
    "      $name$_.get(index).getValue($type$.getDefaultInstance());\n"
    "}\n");
}